

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_setdelegate(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *pSVar3;
  SQObjectType SVar4;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  pSVar3 = SQVM::GetUp(v,-1);
  SVar4 = (pSVar2->super_SQObject)._type;
  if (SVar4 == OT_USERDATA) {
    SVar4 = (pSVar3->super_SQObject)._type;
    if (SVar4 == OT_NULL) {
LAB_0010b2c9:
      SQDelegable::SetDelegate((pSVar2->super_SQObject)._unVal.pDelegable,(SQTable *)0x0);
      SQVM::Pop(v);
      return 0;
    }
    if (SVar4 == OT_TABLE) {
      SQDelegable::SetDelegate
                ((pSVar2->super_SQObject)._unVal.pDelegable,(pSVar3->super_SQObject)._unVal.pTable);
LAB_0010b2b7:
      SQVM::Pop(v);
      return 0;
    }
    SVar4 = OT_USERDATA;
  }
  else if (SVar4 == OT_TABLE) {
    SVar4 = (pSVar3->super_SQObject)._type;
    if (SVar4 == OT_NULL) goto LAB_0010b2c9;
    if (SVar4 == OT_TABLE) {
      bVar1 = SQDelegable::SetDelegate
                        ((pSVar2->super_SQObject)._unVal.pDelegable,
                         (pSVar3->super_SQObject)._unVal.pTable);
      if (!bVar1) {
        sq_throwerror(v,"delagate cycle");
        return -1;
      }
      goto LAB_0010b2b7;
    }
    SVar4 = OT_TABLE;
  }
  sq_aux_invalidtype(v,SVar4);
  return -1;
}

Assistant:

SQRESULT sq_setdelegate(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self = stack_get(v, idx);
    SQObjectPtr &mt = v->GetUp(-1);
    SQObjectType type = sq_type(self);
    switch(type) {
    case OT_TABLE:
        if(sq_type(mt) == OT_TABLE) {
            if(!_table(self)->SetDelegate(_table(mt))) {
                return sq_throwerror(v, _SC("delagate cycle"));
            }
            v->Pop();
        }
        else if(sq_type(mt)==OT_NULL) {
            _table(self)->SetDelegate(NULL); v->Pop(); }
        else return sq_aux_invalidtype(v,type);
        break;
    case OT_USERDATA:
        if(sq_type(mt)==OT_TABLE) {
            _userdata(self)->SetDelegate(_table(mt)); v->Pop(); }
        else if(sq_type(mt)==OT_NULL) {
            _userdata(self)->SetDelegate(NULL); v->Pop(); }
        else return sq_aux_invalidtype(v, type);
        break;
    default:
            return sq_aux_invalidtype(v, type);
        break;
    }
    return SQ_OK;
}